

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile.cpp
# Opt level: O2

void __thiscall LogFile::Append(LogFile *this,char *data,size_t writeSize)

{
  ulong uVar1;
  time_t tVar2;
  
  if (0x4000000 - writeSize < this->m_writedSize) {
    RollFile(this);
  }
  WriteFile::Append((this->m_ptWriteFile)._M_t.
                    super___uniq_ptr_impl<WriteFile,_std::default_delete<WriteFile>_>._M_t.
                    super__Tuple_impl<0UL,_WriteFile_*,_std::default_delete<WriteFile>_>.
                    super__Head_base<0UL,_WriteFile_*,_false>._M_head_impl,data,writeSize);
  this->m_writedSize = this->m_writedSize + writeSize;
  uVar1 = this->m_cnt + 1;
  this->m_cnt = uVar1;
  if (1000 < uVar1) {
    tVar2 = time((time_t *)0x0);
    if (this->m_lastRollTime < tVar2 - tVar2 % 0x15180) {
      RollFile(this);
    }
    else if (3 < (ulong)(tVar2 - this->m_lastFlushTime)) {
      Flush(this);
      this->m_lastFlushTime = tVar2;
    }
    this->m_cnt = 0;
  }
  return;
}

Assistant:

void LogFile::Append(const char * data, size_t writeSize)
{
	// FIX ME if writeSize is larger than kRollFileSize, will cause wrong
	if (m_writedSize > kRollFileSize - writeSize)
	{
		//std::cout << "RollFile " << __FILE__ << " " << __LINE__ << " " << __func__ << " " << m_writedSize << " " << std::endl; 
		RollFile();
	}
	
	m_ptWriteFile->Append(data, writeSize);
	m_writedSize += writeSize;
	m_cnt += 1;
	
	//std::cout << __FILE__ << " " << __LINE__ << " " << __func__ << " " << m_cnt << " " << m_writedSize << std::endl; 
	
	if (kCheckNSteps < m_cnt)
	{
		time_t nowTime = time(NULL);
		time_t nextStartTime = nowTime / kRollPerSeconds * kRollPerSeconds;
		// next day shoule roll log file
		if (m_lastRollTime < nextStartTime)
		{
			//std::cout << "RollFile " << __FILE__ << " " << __LINE__ << " " << __func__ << " " << nowTime << " " << m_lastFlushTime << std::endl; 
			RollFile();
		}
		else if (kFlushInteralSeconds < nowTime - m_lastFlushTime)
		{
			//std::cout << "Flush " << __FILE__ << " " << __LINE__ << " " << __func__ << " " << nowTime << " " << m_lastFlushTime << std::endl; 
			Flush();
			m_lastFlushTime = nowTime;
		}
		
		m_cnt = 0;
	}
}